

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O3

void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)

{
  sysbvm_chunkedAllocatorChunk_s *psVar1;
  sysbvm_chunkedAllocatorChunk_s *memory;
  sysbvm_chunkedAllocatorChunk_t *psVar2;
  sysbvm_chunkedAllocatorChunk_t *writeableMapping;
  size_t sizeToFree;
  
  psVar2 = allocator->firstChunk;
  while (psVar2 != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    psVar1 = psVar2->next;
    memory = psVar2->writeableMapping;
    sizeToFree = psVar2->capacity + 0x40;
    if ((allocator->requiresExecutableMapping == true) && (memory != psVar2->executableMapping)) {
      sysbvm_virtualMemory_freeSystemMemoryWithDualMapping
                (sizeToFree,psVar2->dualMappingHandle,memory,psVar2->executableMapping);
      psVar2 = psVar1;
    }
    else {
      psVar2 = psVar1;
      if (memory != (sysbvm_chunkedAllocatorChunk_s *)0x0) {
        sysbvm_virtualMemory_freeSystemMemory(memory,sizeToFree);
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)
{
    sysbvm_chunkedAllocatorChunk_t *chunk = allocator->firstChunk;
    while(chunk)
    {
        sysbvm_chunkedAllocatorChunk_t *nextChunk = chunk->next;
        size_t fullChunkSize = sizeof(sysbvm_chunkedAllocatorChunk_t) + chunk->capacity;

        if(allocator->requiresExecutableMapping && chunk->writeableMapping != chunk->executableMapping)
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            sysbvm_chunkedAllocatorChunk_t *executableMapping = chunk->executableMapping;
            sysbvm_virtualMemory_freeSystemMemoryWithDualMapping(fullChunkSize, chunk->dualMappingHandle, writeableMapping, executableMapping);
            chunk = nextChunk;

        }
        else
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            if(writeableMapping)
                sysbvm_virtualMemory_freeSystemMemory(writeableMapping, fullChunkSize);
        }

        chunk = nextChunk;
    }
}